

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfWrite.c
# Opt level: O2

int Cnf_IsopCountLiterals(Vec_Int_t *vIsop,int nVars)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int i;
  bool bVar4;
  
  iVar3 = 0;
  if (nVars < 1) {
    nVars = iVar3;
  }
  for (i = 0; i < vIsop->nSize; i = i + 1) {
    uVar1 = Vec_IntEntry(vIsop,i);
    iVar2 = nVars;
    while (bVar4 = iVar2 != 0, iVar2 = iVar2 + -1, bVar4) {
      iVar3 = iVar3 + (uint)((uVar1 & 3) - 1 < 2);
      uVar1 = (int)uVar1 >> 2;
    }
  }
  return iVar3;
}

Assistant:

int Cnf_IsopCountLiterals( Vec_Int_t * vIsop, int nVars )
{
    int nLits = 0, Cube, i, b;
    Vec_IntForEachEntry( vIsop, Cube, i )
    {
        for ( b = 0; b < nVars; b++ )
        {
            if ( (Cube & 3) == 1 || (Cube & 3) == 2 )
                nLits++;
            Cube >>= 2;
        }
    }
    return nLits;
}